

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VMaxNormLocal(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  timespec spec;
  timespec local_30;
  
  N_VConst(0);
  set_element(X,param_2 + -1,-(double)(myid + 1));
  iVar4 = 1;
  clock_gettime(1,&local_30);
  lVar2 = local_30.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_30.tv_nsec;
  dVar5 = (double)N_VMaxNormLocal(X);
  sync_device(X);
  clock_gettime(1,&local_30);
  lVar3 = local_30.tv_sec - base_time_tv_sec;
  if (0.0 <= dVar5) {
    iVar1 = SUNRCompareTol(SUB84(dVar5,0),(double)(myid + 1),0x3e50000000000000);
    if (iVar1 == 0) {
      iVar4 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VMaxNormLocal");
      }
      goto LAB_0010e9fa;
    }
  }
  printf(">>> FAILED test -- N_VMaxNormLocal, Proc %d\n",(ulong)(uint)myid);
LAB_0010e9fa:
  dVar5 = max_time(X,((double)local_30.tv_nsec / 1000000000.0 + (double)lVar3) -
                     (dVar6 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VMaxNormLocal");
  }
  return iVar4;
}

Assistant:

int Test_N_VMaxNormLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, myidp1;

  /* fill vector data */
  myidp1 = (sunrealtype)(myid + 1);
  N_VConst(NEG_HALF, X);
  set_element(X, local_length - 1, -myidp1);

  start_time = get_time();
  ans        = N_VMaxNormLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myidp1 */
  failure =
    (ans < ZERO) ? 1 : SUNRCompareTol(ans, myidp1, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VMaxNormLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VMaxNormLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VMaxNormLocal", maxt);

  return (fails);
}